

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spm.cpp
# Opt level: O3

void __thiscall pg::SPMSolver::run(SPMSolver *this)

{
  uint64_t *puVar1;
  char cVar2;
  iterator iVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  undefined4 uVar7;
  int *piVar8;
  int *piVar9;
  int *piVar10;
  ulong uVar11;
  void *__s;
  _Elt_pointer piVar12;
  ostream *poVar13;
  long lVar14;
  uint *puVar15;
  Game *pGVar16;
  Error *this_00;
  int i;
  int iVar17;
  uint uVar18;
  _Elt_pointer piVar19;
  int i_1;
  uint uVar20;
  char *pcVar21;
  int from;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  int from_1;
  ulong uVar25;
  uint *puVar26;
  int n;
  vector<int,_std::allocator<int>_> cycles;
  queue<int,_std::deque<int,_std::allocator<int>_>_> cm_queue;
  uint local_11c;
  ulong local_118;
  ulong local_110;
  int *local_108;
  void *local_100;
  int *local_f8;
  ulong local_f0;
  uint *local_e8;
  iterator iStack_e0;
  int *local_d8;
  uint local_c4;
  ulong local_c0;
  int *local_b8;
  long local_b0;
  _Deque_base<int,_std::allocator<int>_> local_a8;
  int64_t *local_50;
  long local_48;
  char *local_40;
  long local_38;
  
  pGVar16 = (this->super_Solver).game;
  uVar22 = pGVar16->n_vertices;
  local_b8 = pGVar16->_priority;
  uVar5 = *(uint *)((long)local_b8 + ((long)((uVar22 << 0x20) + -0x100000000) >> 0x1e));
  local_c0 = (ulong)uVar5;
  local_110 = 2;
  if (0 < (int)uVar5) {
    local_110 = (ulong)(uVar5 + 1);
  }
  iVar17 = (int)local_110;
  lVar23 = (long)iVar17;
  uVar24 = uVar22 * lVar23;
  this->k = lVar23;
  local_f0 = uVar24 * 4;
  local_108 = (int *)operator_new__(-(ulong)(uVar24 >> 0x3e != 0) | local_f0);
  this->pms = local_108;
  local_118 = uVar22 * 4;
  uVar25 = -(ulong)(uVar22 >> 0x3e != 0) | local_118;
  local_f8 = (int *)operator_new__(uVar25);
  this->strategy = local_f8;
  uVar11 = 0xffffffffffffffff;
  if (-1 < iVar17) {
    uVar11 = lVar23 * 4;
  }
  piVar8 = (int *)operator_new__(uVar11);
  this->counts = piVar8;
  piVar9 = (int *)operator_new__(uVar11);
  this->tmp = piVar9;
  piVar9 = (int *)operator_new__(uVar11);
  this->best = piVar9;
  piVar9 = (int *)operator_new__(uVar25);
  this->dirty = piVar9;
  local_100 = (void *)uVar25;
  piVar10 = (int *)operator_new__(uVar25);
  this->unstable = piVar10;
  if (0 < (long)uVar24) {
    memset(local_108,0,local_f0);
  }
  if (0 < (long)uVar22) {
    memset(local_f8,0xff,local_118);
  }
  iVar17 = (int)local_110;
  if (0 < iVar17) {
    uVar11 = 1;
    if (1 < (int)local_c0) {
      uVar11 = local_c0 & 0xffffffff;
    }
    memset(piVar8,0,uVar11 * 4 + 4);
  }
  uVar11 = local_118;
  if (0 < (long)uVar22) {
    uVar24 = 0;
    puVar1 = ((this->super_Solver).disabled)->_bits;
    do {
      if ((puVar1[uVar24 >> 6] >> (uVar24 & 0x3f) & 1) == 0) {
        piVar8[local_b8[uVar24]] = piVar8[local_b8[uVar24]] + 1;
      }
      uVar24 = uVar24 + 1;
    } while (uVar22 != uVar24);
  }
  if (iVar17 < 1) {
    piVar10 = (int *)0xffffffff;
    local_110 = 0xffffffff;
  }
  else {
    piVar10 = (int *)0xffffffff;
    local_110 = (ulong)(iVar17 - 1);
    do {
      uVar24 = (ulong)piVar10;
      if (piVar8[local_110] != 0) {
        if ((int)piVar10 == -1) {
          uVar24 = local_110 & 0xffffffff;
        }
        if ((local_110 & 1) == 0) goto LAB_001610eb;
      }
      piVar10 = (int *)uVar24;
      bVar4 = 0 < (long)local_110;
      local_110 = local_110 - 1;
    } while (bVar4);
    local_110 = 0xffffffff;
  }
LAB_001610eb:
  if ((long)uVar22 < 1) {
    __s = operator_new__((ulong)local_100);
  }
  else {
    memset(piVar9,0,local_118);
    __s = operator_new__((ulong)local_100);
    memset(__s,0,uVar11);
  }
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_a8,0);
  local_d8 = (int *)0x0;
  local_e8 = (uint *)0x0;
  iStack_e0._M_current = (int *)0x0;
  this->lift_attempt = 0;
  this->lift_count = 0;
  uVar5 = (int)((this->super_Solver).game)->n_vertices - 1;
  if (-1 < (int)uVar5) {
    uVar22 = (ulong)uVar5;
    do {
      if ((((this->super_Solver).disabled)->_bits[uVar22 >> 6] >> (uVar22 & 0x3f) & 1) == 0) {
        bVar4 = lift(this,(int)uVar22,-1);
        if (bVar4) {
          pGVar16 = (this->super_Solver).game;
          piVar8 = pGVar16->_inedges;
          lVar23 = (long)pGVar16->_firstins[uVar22];
          iVar17 = piVar8[lVar23];
          if (iVar17 != -1) {
            piVar8 = piVar8 + lVar23 + 1;
            do {
              if (((((this->super_Solver).disabled)->_bits[(ulong)(long)iVar17 >> 6] >>
                    ((long)iVar17 & 0x3fU) & 1) == 0) &&
                 (bVar4 = lift(this,iVar17,(int)uVar22), bVar4)) {
                todo_push(this,iVar17);
              }
              iVar17 = *piVar8;
              piVar8 = piVar8 + 1;
            } while (iVar17 != -1);
          }
        }
      }
      bVar4 = 0 < (long)uVar22;
      uVar22 = uVar22 - 1;
    } while (bVar4);
  }
  local_50 = &this->lift_attempt;
  piVar19 = (this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
            ._M_finish._M_cur;
  local_b0 = 0;
  piVar12 = (this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
            ._M_start._M_cur;
  local_100 = __s;
LAB_00161248:
  lVar23 = local_b0;
  local_f8 = piVar10;
  if (piVar19 != piVar12) {
    do {
      iVar6 = todo_pop(this);
      pGVar16 = (this->super_Solver).game;
      iVar17 = pGVar16->_inedges[pGVar16->_firstins[iVar6]];
      if (iVar17 != -1) {
        piVar8 = pGVar16->_inedges + (long)pGVar16->_firstins[iVar6] + 1;
        do {
          if (((((this->super_Solver).disabled)->_bits[(ulong)(long)iVar17 >> 6] >>
                ((long)iVar17 & 0x3fU) & 1) == 0) && (bVar4 = lift(this,iVar17,iVar6), bVar4)) {
            todo_push(this,iVar17);
          }
          iVar17 = *piVar8;
          piVar8 = piVar8 + 1;
        } while (iVar17 != -1);
        pGVar16 = (this->super_Solver).game;
      }
      lVar14 = this->lift_count;
      if (lVar23 + pGVar16->n_vertices * 10 < lVar14) {
        update(this,0);
        update(this,1);
        lVar23 = lVar14;
      }
    } while ((this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur !=
             (this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur);
  }
  local_b0 = lVar23;
  if ((1 < (this->super_Solver).trace) &&
     (lVar14 = ((this->super_Solver).game)->n_vertices, 0 < lVar14)) {
    uVar22 = 0;
    do {
      if ((((this->super_Solver).disabled)->_bits[uVar22 >> 6] >> (uVar22 & 0x3f) & 1) == 0) {
        poVar13 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar13,"\x1b[35m**\x1b[m \x1b[1mnode ",0x14);
        poVar13 = (ostream *)std::ostream::operator<<(poVar13,(int)uVar22);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"/",1);
        poVar13 = (ostream *)
                  std::ostream::operator<<(poVar13,((this->super_Solver).game)->_priority[uVar22]);
        pcVar21 = " (odd)";
        bVar4 = ((((this->super_Solver).game)->_owner)._bits[uVar22 >> 6] & 1L << (uVar22 & 0x3f))
                == 0;
        if (bVar4) {
          pcVar21 = " (even)";
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar21,(ulong)bVar4 | 6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\x1b[m is",6);
        pm_stream(this,(this->super_Solver).logger,this->pms + this->k * uVar22);
        poVar13 = (this->super_Solver).logger;
        cVar2 = (char)poVar13;
        std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + cVar2);
        std::ostream::put(cVar2);
        std::ostream::flush();
        lVar14 = ((this->super_Solver).game)->n_vertices;
      }
      uVar22 = uVar22 + 1;
    } while ((long)uVar22 < lVar14);
  }
  uVar22 = CONCAT71((int7)((ulong)lVar23 >> 8),1);
  local_118 = 0;
  piVar10 = local_f8;
LAB_00161463:
  if (0 < this->k) {
    memset(this->best,0,this->k << 2);
  }
  local_11c = 0;
  local_c4 = (uint)uVar22;
  uVar7 = (int)piVar10;
  if ((char)uVar22 != '\0') {
    uVar7 = (int)local_110;
  }
  local_c0 = CONCAT44(local_c0._4_4_,uVar7);
  local_f8 = piVar10;
  if (0 < ((this->super_Solver).game)->n_vertices) {
    local_40 = " odd";
    local_108 = (int *)CONCAT44(local_108._4_4_,0xffffffff);
    local_f0 = CONCAT44(local_f0._4_4_,0xffffffff);
    if ((char)uVar22 != '\0') {
      local_40 = " even";
    }
    local_40 = local_40 + 1;
    uVar11 = 0;
    local_48 = (uVar22 & 0xff) + 3;
LAB_001614ee:
    if ((((this->super_Solver).disabled)->_bits[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) == 0) {
      piVar8 = this->pms + uVar11 * this->k;
      if ((piVar8[local_118] != -1) &&
         (uVar5 = (uint)this->k, uVar5 = ~(uint)((uVar5 & 1) == local_118) + uVar5, -1 < (int)uVar5)
         ) {
        do {
          if (this->counts[uVar5] < piVar8[uVar5]) {
            if ((this->super_Solver).trace < 2) goto LAB_001616ea;
            poVar13 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\x1b[31;1m",7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13,local_40,local_48);
            pcVar21 = " loser ";
            bVar4 = local_118 ==
                    (((((this->super_Solver).game)->_owner)._bits[(ulong)(long)(int)local_11c >> 6]
                      >> ((long)(int)local_11c & 0x3fU) & 1) != 0);
            if (bVar4) {
              pcVar21 = " winner ";
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar21,(ulong)bVar4 + 7);
            poVar13 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>(poVar13,"loops\x1b[m: ",10);
            poVar13 = (ostream *)std::ostream::operator<<(poVar13,local_11c);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13,"/",1);
            poVar13 = (ostream *)
                      std::ostream::operator<<
                                (poVar13,((this->super_Solver).game)->_priority[(int)local_11c]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13," (cm = ",7);
            uVar18 = (uint)this->k;
            uVar18 = ~(uint)((uVar18 & 1) == local_118) + uVar18;
            uVar20 = 0xffffffff;
            if ((int)uVar18 < 0) goto LAB_00161694;
            goto LAB_0016167b;
          }
          bVar4 = 1 < (int)uVar5;
          uVar5 = uVar5 - 2;
        } while (bVar4);
      }
    }
    goto LAB_00161506;
  }
  goto LAB_00161b21;
  while (bVar4 = 1 < (int)uVar18, uVar18 = uVar18 - 2, uVar20 = 0xffffffff, bVar4) {
LAB_0016167b:
    uVar20 = uVar18;
    if (this->counts[uVar18] < piVar8[uVar18]) break;
  }
LAB_00161694:
  poVar13 = (ostream *)std::ostream::operator<<(poVar13,uVar20);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,")",1);
  pm_stream(this,(this->super_Solver).logger,piVar8);
  poVar13 = (this->super_Solver).logger;
  cVar2 = (char)poVar13;
  std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
LAB_001616ea:
  if ((uint)local_c0 == uVar5) {
    this->pms[(long)(int)local_11c * this->k + local_118] = -1;
    todo_push(this,local_11c);
    uVar5 = ((this->super_Solver).game)->_priority[(int)local_11c];
    if (local_118 == (uVar5 & 1)) {
      this->counts[(int)uVar5] = this->counts[(int)uVar5] + -1;
    }
    if ((this->super_Solver).trace != 0) {
      poVar13 = (this->super_Solver).logger;
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\x1b[1;36mupdated node ",0x14);
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,local_11c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"/",1);
      poVar13 = (ostream *)
                std::ostream::operator<<
                          (poVar13,((this->super_Solver).game)->_priority[(int)local_11c]);
      pcVar21 = " (odd)";
      bVar4 = ((((this->super_Solver).game)->_owner)._bits[(ulong)(long)(int)local_11c >> 6] >>
               ((long)(int)local_11c & 0x3fU) & 1) != 0;
      if (!bVar4) {
        pcVar21 = " (even)";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar21,7 - (ulong)bVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\x1b[m to",6);
      pm_stream(this,(this->super_Solver).logger,this->pms + (long)(int)local_11c * this->k);
      poVar13 = (this->super_Solver).logger;
      cVar2 = (char)poVar13;
      std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
    }
  }
  else {
    if (iStack_e0._M_current == local_d8) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&local_e8,iStack_e0,(int *)&local_11c);
    }
    else {
      *iStack_e0._M_current = local_11c;
      iStack_e0._M_current = iStack_e0._M_current + 1;
    }
    pGVar16 = (this->super_Solver).game;
    uVar22 = (ulong)(int)local_11c;
    if (local_118 != (((pGVar16->_owner)._bits[uVar22 >> 6] >> (uVar22 & 0x3f) & 1) != 0)) {
      iVar17 = pGVar16->_outedges[pGVar16->_firstouts[uVar22]];
      if (iVar17 != -1) {
        piVar8 = pGVar16->_outedges + pGVar16->_firstouts[uVar22];
        local_b8 = (int *)CONCAT44(local_b8._4_4_,pGVar16->_priority[uVar22]);
        do {
          uVar22 = (ulong)iVar17;
          if (((((this->super_Solver).disabled)->_bits[uVar22 >> 6] >> (uVar22 & 0x3f) & 1) == 0) &&
             (__s = local_100, (this->pms + uVar22 * this->k)[local_118] != -1)) {
            iVar6 = (int)local_118;
            Prog(this,this->tmp,this->pms + uVar22 * this->k,(int)local_b8,iVar6);
            lVar23 = this->k;
            local_38 = (long)(int)local_11c;
            piVar9 = this->tmp;
            bVar4 = pm_less(this,this->pms + lVar23 * local_38,piVar9,(int)local_b8,iVar6);
            __s = local_100;
            if ((bVar4) &&
               (((int)local_f0 == -1 ||
                (bVar4 = pm_less(this,piVar9,this->best,0,(int)local_118), bVar4)))) {
              if ((long)local_118 < lVar23) {
                piVar10 = this->best;
                uVar22 = local_118;
                do {
                  piVar10[uVar22] = piVar9[uVar22];
                  uVar22 = uVar22 + 2;
                  uVar5 = local_11c;
                } while ((long)uVar22 < lVar23);
              }
              else {
                uVar5 = (uint)local_38;
              }
              local_f0 = CONCAT44(local_f0._4_4_,iVar17);
              local_108 = (int *)CONCAT44(local_108._4_4_,uVar5);
            }
          }
          iVar17 = piVar8[1];
          piVar8 = piVar8 + 1;
        } while (iVar17 != -1);
      }
    }
  }
LAB_00161506:
  uVar11 = (long)(int)local_11c + 1;
  local_11c = (uint)uVar11;
  if (((this->super_Solver).game)->n_vertices <= (long)uVar11) goto LAB_001619d0;
  goto LAB_001614ee;
LAB_001619d0:
  if ((int)local_f0 == -1) {
LAB_00161b21:
    iVar3._M_current = iStack_e0._M_current;
    uVar22 = local_118;
    puVar15 = local_e8;
    if (local_e8 != (uint *)iStack_e0._M_current) {
      do {
        uVar5 = *puVar15;
        puVar15 = puVar15 + 1;
        *(undefined4 *)((long)__s + (long)(int)uVar5 * 4) = 1;
        puVar26 = local_e8;
      } while (puVar15 != (uint *)iStack_e0._M_current);
      for (; puVar26 != (uint *)iVar3._M_current; puVar26 = puVar26 + 1) {
        local_11c = *puVar26;
        uVar11 = (ulong)(int)local_11c;
        pGVar16 = (this->super_Solver).game;
        piVar8 = pGVar16->_outedges;
        lVar23 = (long)pGVar16->_firstouts[uVar11];
        iVar17 = piVar8[lVar23];
        uVar24 = (ulong)((uint)((pGVar16->_owner)._bits[uVar11 >> 6] >> (uVar11 & 0x3f)) & 1);
        if (uVar22 == uVar24) {
          if (iVar17 != -1) {
            piVar8 = piVar8 + lVar23 + 1;
            do {
              uVar25 = (ulong)iVar17;
              if (((((this->super_Solver).disabled)->_bits[uVar25 >> 6] >> (uVar25 & 0x3f) & 1) == 0
                  ) && (*(int *)((long)__s + uVar25 * 4) != 0)) goto LAB_00161c6b;
              iVar17 = *piVar8;
              piVar8 = piVar8 + 1;
            } while (iVar17 != -1);
LAB_00161c23:
            if (uVar22 != uVar24) goto LAB_00161c6b;
          }
LAB_00161c28:
          *(undefined4 *)((long)__s + uVar11 * 4) = 0;
          if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_a8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                      ((deque<int,std::allocator<int>> *)&local_a8,(int *)&local_11c);
          }
          else {
            *local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_11c;
            local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
          }
        }
        else if (iVar17 != -1) {
          piVar8 = piVar8 + lVar23 + 1;
          do {
            uVar25 = (ulong)iVar17;
            if ((((((this->super_Solver).disabled)->_bits[uVar25 >> 6] >> (uVar25 & 0x3f) & 1) == 0)
                && (this->pms[uVar22 + this->k * uVar25] != -1)) &&
               (*(int *)((long)__s + uVar25 * 4) == 0)) goto LAB_00161c28;
            iVar17 = *piVar8;
            piVar8 = piVar8 + 1;
          } while (iVar17 != -1);
          goto LAB_00161c23;
        }
LAB_00161c6b:
      }
    }
    while (iVar3._M_current = iStack_e0._M_current,
          local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_a8._M_impl.super__Deque_impl_data._M_start._M_cur) {
      uVar5 = *local_a8._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (local_a8._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_a8._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_a8._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
        local_a8._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_a8._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_a8._M_impl.super__Deque_impl_data._M_start._M_last =
             (_Elt_pointer)((uint *)local_a8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x80);
        local_a8._M_impl.super__Deque_impl_data._M_start._M_first =
             local_a8._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_a8._M_impl.super__Deque_impl_data._M_start._M_node =
             local_a8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_a8._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_a8._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      pGVar16 = (this->super_Solver).game;
      piVar8 = pGVar16->_inedges;
      iVar17 = pGVar16->_firstins[(int)uVar5];
      uVar5 = piVar8[iVar17];
      if (uVar5 != 0xffffffff) {
        piVar8 = piVar8 + iVar17;
        do {
          uVar11 = (ulong)(int)uVar5;
          puVar1 = ((this->super_Solver).disabled)->_bits;
          local_11c = uVar5;
          if (((puVar1[uVar11 >> 6] >> (uVar5 & 0x3f) & 1) == 0) &&
             (*(int *)((long)__s + uVar11 * 4) != 0)) {
            pGVar16 = (this->super_Solver).game;
            if (uVar22 == (((pGVar16->_owner)._bits[uVar11 >> 6] >> (uVar5 & 0x3f) & 1) != 0)) {
              iVar17 = pGVar16->_outedges[pGVar16->_firstouts[uVar11]];
              if (iVar17 != -1) {
                piVar9 = pGVar16->_outedges + (long)pGVar16->_firstouts[uVar11] + 1;
                do {
                  uVar24 = (ulong)iVar17;
                  if (((puVar1[uVar24 >> 6] >> (uVar24 & 0x3f) & 1) == 0) &&
                     (*(int *)((long)__s + uVar24 * 4) != 0)) goto LAB_00161d35;
                  iVar17 = *piVar9;
                  piVar9 = piVar9 + 1;
                } while (iVar17 != -1);
              }
            }
            *(undefined4 *)((long)__s + uVar11 * 4) = 0;
            if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_a8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
              std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                        ((deque<int,std::allocator<int>> *)&local_a8,(int *)&local_11c);
            }
            else {
              *local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur = uVar5;
              local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
            }
          }
LAB_00161d35:
          uVar5 = piVar8[1];
          piVar8 = piVar8 + 1;
        } while (uVar5 != 0xffffffff);
      }
    }
    puVar15 = local_e8;
    if (local_e8 == (uint *)iStack_e0._M_current) goto LAB_00161f79;
    do {
      uVar22 = local_118;
      uVar5 = *puVar15;
      uVar11 = (ulong)(int)uVar5;
      if (*(int *)((long)__s + uVar11 * 4) != 0) {
        *(undefined4 *)((long)__s + uVar11 * 4) = 0;
        this->pms[this->k * uVar11 + local_118] = -1;
        todo_push(this,uVar5);
        __s = local_100;
        uVar18 = ((this->super_Solver).game)->_priority[uVar11];
        if (uVar22 == (uVar18 & 1)) {
          this->counts[(int)uVar18] = this->counts[(int)uVar18] + -1;
        }
        if ((this->super_Solver).trace != 0) {
          poVar13 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\x1b[1;36mupdated node ",0x14)
          ;
          poVar13 = (ostream *)std::ostream::operator<<(poVar13,uVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,"/",1);
          poVar13 = (ostream *)
                    std::ostream::operator<<(poVar13,((this->super_Solver).game)->_priority[uVar11])
          ;
          pcVar21 = " (odd)";
          bVar4 = ((((this->super_Solver).game)->_owner)._bits[uVar11 >> 6] >> (uVar11 & 0x3f) & 1)
                  != 0;
          if (!bVar4) {
            pcVar21 = " (even)";
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar21,7 - (ulong)bVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\x1b[m to",6);
          pm_stream(this,(this->super_Solver).logger,this->pms + uVar11 * this->k);
          poVar13 = (this->super_Solver).logger;
          cVar2 = (char)poVar13;
          std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + cVar2);
          std::ostream::put(cVar2);
          std::ostream::flush();
        }
      }
      puVar15 = puVar15 + 1;
    } while (puVar15 != (uint *)iVar3._M_current);
  }
  else {
    uVar22 = (ulong)(int)local_108;
    this->strategy[uVar22] = (int)local_f0;
    lVar23 = this->k;
    if ((long)local_118 < lVar23) {
      piVar8 = this->best;
      piVar9 = this->pms;
      uVar11 = local_118;
      do {
        piVar9[lVar23 * uVar22 + uVar11] = piVar8[uVar11];
        uVar11 = uVar11 + 2;
      } while ((long)uVar11 < lVar23);
    }
    todo_push(this,(int)local_108);
    if ((this->super_Solver).trace != 0) {
      poVar13 = (this->super_Solver).logger;
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\x1b[1;36mupdated node ",0x14);
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,(int)local_108);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"/",1);
      poVar13 = (ostream *)
                std::ostream::operator<<(poVar13,((this->super_Solver).game)->_priority[uVar22]);
      pcVar21 = " (odd)";
      bVar4 = ((((this->super_Solver).game)->_owner)._bits[uVar22 >> 6] >> (uVar22 & 0x3f) & 1) != 0
      ;
      if (!bVar4) {
        pcVar21 = " (even)";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar21,7 - (ulong)bVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\x1b[m to",6);
      pm_stream(this,(this->super_Solver).logger,this->pms + uVar22 * this->k);
      poVar13 = (this->super_Solver).logger;
      cVar2 = (char)poVar13;
      std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
    }
  }
  if ((uint *)iStack_e0._M_current != local_e8) {
    iStack_e0._M_current = (int *)local_e8;
  }
LAB_00161f79:
  uVar5 = local_c4;
  piVar10 = local_f8;
  if (this->counts[(int)(uint)local_c0] == 0) {
    if (1 < (this->super_Solver).trace) {
      poVar13 = (this->super_Solver).logger;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar13,"\x1b[1mlowering max\x1b[m for player ",0x1f);
      pcVar21 = " odd";
      if ((uVar5 & 1) != 0) {
        pcVar21 = " even";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar21 + 1,(ulong)(uVar5 & 1) + 3)
      ;
      std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
    }
    if ((uVar5 & 1) == 0) {
      if ((int)piVar10 < 1) goto LAB_00162093;
      do {
        iVar17 = (int)piVar10;
        if (this->counts[(ulong)piVar10 & 0xffffffff] != 0) goto LAB_00161f91;
        uVar18 = iVar17 - 2;
        piVar10 = (int *)(ulong)uVar18;
      } while (2 < iVar17);
      piVar10 = (int *)(ulong)uVar18;
    }
    else if (0 < (int)local_110) {
      do {
        iVar17 = (int)local_110;
        if (this->counts[local_110 & 0xffffffff] != 0) goto LAB_00161f91;
        uVar18 = iVar17 - 2;
        local_110 = (ulong)uVar18;
      } while (2 < iVar17);
      local_110 = (ulong)uVar18;
    }
  }
LAB_00161f91:
  local_118 = 1;
  uVar22 = 0;
  if ((uVar5 & 1) == 0) goto LAB_00162093;
  goto LAB_00161463;
LAB_00162093:
  piVar12 = (this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
            ._M_start._M_cur;
  piVar19 = (this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
            ._M_finish._M_cur;
  if (piVar19 == piVar12) goto code_r0x001620aa;
  goto LAB_00161248;
code_r0x001620aa:
  pGVar16 = (this->super_Solver).game;
  lVar23 = pGVar16->n_vertices;
  if (1 < (this->super_Solver).trace) {
    if (lVar23 < 1) goto LAB_0016227d;
    uVar22 = 0;
    do {
      if ((((this->super_Solver).disabled)->_bits[uVar22 >> 6] >> (uVar22 & 0x3f) & 1) == 0) {
        poVar13 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar13,"\x1b[35m**\x1b[m \x1b[1mnode ",0x14);
        poVar13 = (ostream *)std::ostream::operator<<(poVar13,(int)uVar22);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"/",1);
        poVar13 = (ostream *)
                  std::ostream::operator<<(poVar13,((this->super_Solver).game)->_priority[uVar22]);
        pcVar21 = " (odd)";
        bVar4 = ((((this->super_Solver).game)->_owner)._bits[uVar22 >> 6] & 1L << (uVar22 & 0x3f))
                == 0;
        if (bVar4) {
          pcVar21 = " (even)";
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar21,(ulong)bVar4 | 6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\x1b[m is",6);
        pm_stream(this,(this->super_Solver).logger,this->pms + this->k * uVar22);
        poVar13 = (this->super_Solver).logger;
        cVar2 = (char)poVar13;
        std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + cVar2);
        std::ostream::put(cVar2);
        std::ostream::flush();
        pGVar16 = (this->super_Solver).game;
        lVar23 = pGVar16->n_vertices;
      }
      uVar22 = uVar22 + 1;
    } while ((long)uVar22 < lVar23);
  }
  if (0 < lVar23) {
    uVar22 = 0;
    do {
      if ((((this->super_Solver).disabled)->_bits[uVar22 >> 6] >> (uVar22 & 0x3f) & 1) == 0) {
        lVar23 = this->k * uVar22;
        iVar17 = this->pms[lVar23];
        if ((iVar17 == -1) != (this->pms[lVar23 + 1] != -1)) {
          this_00 = (Error *)__cxa_allocate_exception(0x40);
          Error::Error(this_00,"logic error",
                       "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/spm.cpp"
                       ,0x273);
          __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
        }
        iVar6 = -1;
        if ((((pGVar16->_owner)._bits[uVar22 >> 6] & 1L << (uVar22 & 0x3f)) != 0) == (iVar17 != -1))
        {
          iVar6 = this->strategy[uVar22];
        }
        Oink::solve((this->super_Solver).oink,(int)uVar22,(uint)(iVar17 != -1),iVar6);
        pGVar16 = (this->super_Solver).game;
        lVar23 = pGVar16->n_vertices;
      }
      uVar22 = uVar22 + 1;
    } while ((long)uVar22 < lVar23);
  }
LAB_0016227d:
  if (this->pms != (int *)0x0) {
    operator_delete__(this->pms);
  }
  if (this->strategy != (int *)0x0) {
    operator_delete__(this->strategy);
  }
  if (this->counts != (int *)0x0) {
    operator_delete__(this->counts);
  }
  if (this->tmp != (int *)0x0) {
    operator_delete__(this->tmp);
  }
  if (this->best != (int *)0x0) {
    operator_delete__(this->best);
  }
  if (this->dirty != (int *)0x0) {
    operator_delete__(this->dirty);
  }
  operator_delete__(__s);
  if (this->unstable != (int *)0x0) {
    operator_delete__(this->unstable);
  }
  poVar13 = (this->super_Solver).logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"solved with ",0xc);
  poVar13 = std::ostream::_M_insert<long>((long)poVar13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13," lifts, ",8);
  poVar13 = std::ostream::_M_insert<long>((long)poVar13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13," lift attempts.",0xf);
  std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
  std::ostream::put((char)poVar13);
  std::ostream::flush();
  if (local_e8 != (uint *)0x0) {
    operator_delete(local_e8,(long)local_d8 - (long)local_e8);
  }
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_a8);
  return;
}

Assistant:

void
SPMSolver::run()
{
    // determine k = highest priority + 1
    k = priority(nodecount()-1)+1;
    if (k < 2) k = 2;

    // now create the data structure, for each node
    pms = new int[(size_t)k*nodecount()];
    strategy = new int[nodecount()];
    counts = new int[k];
    tmp = new int[k];
    best = new int[k];
    dirty = new int[nodecount()];
    unstable = new int[nodecount()];

    int max0 = -1, max1 = -1;

    // initialize all measures to 0
    for (int i=0; i<k*nodecount(); i++) pms[i] = 0;

    // initialize strategy to -1
    for (int i=0; i<nodecount(); i++) strategy[i] = -1;

    // initialize counts for each priority
    for (int i=0; i<k; i++) counts[i] = 0;
    for (int i=0; i<nodecount(); i++) if (disabled[i] == 0) counts[priority(i)]++;
    for (int i=k-1; i>=0; i--) {
        if (counts[i] == 0) continue;
        if (i&1) { if (max1 == -1) max1 = i; }
        else { if (max0 == -1) max0 = i; }
        if (max0 != -1 and max0 != -1) break;
    }

    // initialize all nodes as not dirty
    for (int n=0; n<nodecount(); n++) dirty[n] = 0;

    // allocate and initialize additional array for cycle measures
    int *cm = new int[nodecount()];
    for (int n=0; n<nodecount(); n++) cm[n] = 0;

    // a queue and a vector for cycle measure analysis
    std::queue<int> cm_queue;
    std::vector<int> cycles;

    // set number of lifts and lift attempts to 0
    lift_count = lift_attempt = 0;

    /**
     * Strategy that updates predecessors then marks updated predecessors for processing.
     * Uses a queue to store the dirty vertices.
     */

    /**
     * Initialization loop.
     */

    for (int n=nodecount()-1; n>=0; n--) {
        if (!disabled[n] and lift(n, -1)) {
            for (auto curedge = ins(n); *curedge != -1; curedge++) {
                int from = *curedge;
                if (!disabled[from] and lift(from, n)) todo_push(from);
            }
        }
    }
    
    /**
     * The main loop.
     */

    int64_t last_update = 0;

    while (true) {
        while (!todo.empty()) {
            int n = todo_pop();
            for (auto curedge = ins(n); *curedge != -1; curedge++) {
                int from = *curedge;
                if (!disabled[from] and lift(from, n)) todo_push(from);
            }
            if (last_update + 10*nodecount() < lift_count) {
                last_update = lift_count;
                update(0);
                update(1);
            }
        }

#ifndef NDEBUG
        if (trace >= 2) {
            for (int n=0; n<nodecount(); n++) {
                if (disabled[n]) continue;
                logger << "\033[35m**\033[m \033[1mnode " << n << "/" << priority(n) << (owner(n)?" (odd)":" (even)") << "\033[m is";
                pm_stream(logger, pms + k*n);
                logger << std::endl;
            }
        }
#endif

        /**
         * End of the main loop.
         * When no more lifting occurs, we must analyze nodes with cyclic measures.
         * We analyze for player 0 first, then for player 1.
         */

        for (int pl=0; pl<2; pl++) {
            /**
             * Put all nodes with cycle measures in "cycles"
             * Also find the best (lowest) exit for the loser
             */
            int best_from = -1, best_to = -1;
            for (int i=0; i<k; i++) best[i] = 0;

            int max = pl == 0 ? max0 : max1;

            for (int n=0; n<nodecount(); n++) {
                if (disabled[n]) continue;
                int *pm = pms + k*n;
                if (pm[pl] == -1) continue; // already won
                int c = pm_cycles(pm, pl);
                if (c == -1) continue; // not a cycle measure
#ifndef NDEBUG
                if (trace >= 2) {
                    logger << "\033[31;1m" << (pl ? "odd" : "even") << (pl == owner(n) ? " winner " : " loser ");
                    logger << "loops\033[m: " << n << "/" << priority(n) << " (cm = " << pm_cycles(pm, pl) << ")";
                    pm_stream(logger, pm);
                    logger << std::endl;
                }
#endif
                if (c == max) {
                    pms[n*k + pl] = -1;
                    todo_push(n);

                    const int d = priority(n);
                    if ((d&1) == pl) counts[d]--;

                    if (trace) {
                        logger << "\033[1;36mupdated node " << n << "/" << priority(n) << (owner(n)?" (odd)":" (even)") << "\033[m to";
                        pm_stream(logger, pms + n*k);
                        logger << std::endl;
                    }

                    continue;
                }

                cycles.push_back(n);
                if (owner(n) != pl) {
                    const int d = priority(n);
                    for (auto curedge = outs(n); *curedge != -1; curedge++) {
                        int to = *curedge;
                        if (disabled[to]) continue;
                        int *pm_to = pms + k*to;
                        if (pm_to[pl] == -1) continue; // already won
                        Prog(tmp, pm_to, d, pl);
                        if (!pm_less(pms + k*n, tmp, d, pl)) continue; // candidate must increase measure
                        if (best_to == -1 or pm_less(tmp, best, 0, pl))  {
                            for (int i=pl; i<k; i+=2) best[i] = tmp[i];
                            best_from = n;
                            best_to = to;
                        }
                    }
                }
            }

            if (best_to != -1) {
                /**
                 * OK we found the best exit from <best_from> to <best_to>.
                 */
                strategy[best_from] = best_to;
                pm_copy(pms + best_from*k, best, pl);
                todo_push(best_from);

                if (trace) {
                    logger << "\033[1;36mupdated node " << best_from << "/" << priority(best_from) << (owner(best_from)?" (odd)":" (even)") << "\033[m to";
                    pm_stream(logger, pms + best_from*k);
                    logger << std::endl;
                }

                cycles.clear();
            } else {
                /**
                 * No exit found, everything that remains a cycle after removing escaping nodes is now won.
                 */
                for (int n : cycles) cm[n] = 1; // mark everything in 'cycles'

                for (int n : cycles) {
                    bool escapes;
                    if (owner(n) == pl) {
                        // check if it can stay in cm
                        escapes = true;
                        for (auto curedge = outs(n); *curedge != -1; curedge++) {
                            int m = *curedge;
                            if (disabled[m] == 0 and cm[m]) {
                                escapes = false;
                                break;
                            }
                        }
                    } else {
                        // check if it can move out of cm
                        escapes = false;
                        for (auto curedge = outs(n); *curedge != -1; curedge++) {
                            int m = *curedge;
                            if (disabled[m] == 0 and pms[k*m+pl] != -1 and cm[m] == 0) {
                                escapes = true;
                                break;
                            }
                        }
                    }
                    if (escapes) {
                        cm[n] = 0;
                        cm_queue.push(n);
                    }
                }

                /**
                 * Run backwards search to remove nodes that can escape to non-CM
                 */

                while (!cm_queue.empty()) {
                    int n = cm_queue.front();
                    cm_queue.pop();
                    for (auto curedge = ins(n); *curedge != -1; curedge++) {
                        int m = *curedge;
                        if (disabled[m] != 0 or cm[m] == 0) continue;
                        if (owner(m) == pl) {
                            bool escapes = false;
                            for (auto curedge = outs(m); *curedge != -1; curedge++) {
                                int to = *curedge;
                                if (disabled[to] == 0 and cm[to]) {
                                    escapes = true;
                                    break;
                                }
                            }
                            if (escapes) continue;
                        }
                        cm[m] = 0;
                        cm_queue.push(m);
                    }
                }

                /**
                 * Finally, mark remaining nodes as won
                 */

                for (int n : cycles) {
                    if (cm[n]) {
                        cm[n] = 0;
                        pms[n*k + pl] = -1;
                        todo_push(n);

                        const int d = priority(n);
                        if ((d&1) == pl) counts[d]--;

                        if (trace) {
                            logger << "\033[1;36mupdated node " << n << "/" << priority(n) << (owner(n)?" (odd)":" (even)") << "\033[m to";
                            pm_stream(logger, pms + n*k);
                            logger << std::endl;
                        }
                    }
                }

                cycles.clear();
            }

            if (counts[max] == 0) {
                if (trace >= 2) logger << "\033[1mlowering max\033[m for player " << (pl == 0 ? "even" : "odd") << std::endl;
                if (pl == 0) { while (max0 > 0 and counts[max0] == 0) max0 -= 2; }
                else { while (max1 > 0 and counts[max1] == 0) max1 -= 2; }
            }
        }

        if (todo.empty()) break;
    }

#ifndef NDEBUG
    if (trace >= 2) {
        for (int n=0; n<nodecount(); n++) {
            if (disabled[n]) continue;
            logger << "\033[35m**\033[m \033[1mnode " << n << "/" << priority(n) << (owner(n)?" (odd)":" (even)") << "\033[m is";
            pm_stream(logger, pms + k*n);
            logger << std::endl;
        }
    }
#endif

    // Now set dominions and derive strategy for even.
    for (int n=0; n<nodecount(); n++) {
        if (disabled[n]) continue;
        int *pm = pms + k*n;
        if ((pm[0] == -1) == (pm[1] == -1)) LOGIC_ERROR;
        const int winner = pm[0] == -1 ? 0 : 1;
        Solver::solve(n, winner, owner(n) == winner ? strategy[n] : -1);
    }

    delete[] pms;
    delete[] strategy;
    delete[] counts;
    delete[] tmp;
    delete[] best;
    delete[] dirty;
    delete[] cm;
    delete[] unstable;

    logger << "solved with " << lift_count << " lifts, " << lift_attempt << " lift attempts." << std::endl;
}